

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader.c++
# Opt level: O1

void __thiscall
capnp::SchemaLoader::Impl::makeDep
          (Impl *this,Binding *result,Reader type,StringPtr scopeName,
          Maybe<kj::ArrayPtr<const_capnp::_::RawBrandedSchema::Scope>_> *brandBindings)

{
  undefined8 *puVar1;
  size_t sVar2;
  Scope *pSVar3;
  undefined8 uVar4;
  anon_union_8_2_eba6ea51_for_Binding_4 aVar5;
  Reader type_00;
  Reader brand;
  uint8_t uVar6;
  short sVar7;
  uint16_t uVar8;
  RawBrandedSchema *pRVar9;
  Which whichType;
  ushort uVar10;
  uint64_t typeId;
  long lVar11;
  Which expectedKind;
  Maybe<kj::ArrayPtr<const_capnp::_::RawBrandedSchema::Scope>_> *brandBindings_00;
  Maybe<kj::ArrayPtr<const_capnp::_::RawBrandedSchema::Scope>_> local_170;
  Maybe<kj::ArrayPtr<const_capnp::_::RawBrandedSchema::Scope>_> local_158;
  Maybe<kj::ArrayPtr<const_capnp::_::RawBrandedSchema::Scope>_> local_140;
  Maybe<kj::ArrayPtr<const_capnp::_::RawBrandedSchema::Scope>_> local_128;
  PointerReader local_110;
  StructReader local_f0;
  StructReader local_c0;
  StructReader local_90;
  StructReader local_60;
  
  if (type._reader.dataSize < 0x10) {
    uVar10 = 0;
  }
  else {
    uVar10 = *type._reader.data;
  }
  if (uVar10 < 0xe) {
    if (type._reader.dataSize < 0x10) {
      uVar6 = '\0';
    }
    else {
      uVar6 = *type._reader.data;
    }
    result->which = uVar6;
    return;
  }
  switch(uVar10) {
  case 0xe:
    if (type._reader.pointerCount == 0) {
      type._reader.nestingLimit = 0x7fffffff;
      type._reader.capTable = (CapTableReader *)0x0;
      type._reader.pointers = (WirePointer *)0x0;
      type._reader.segment = (SegmentReader *)0x0;
    }
    local_110.segment = type._reader.segment;
    local_110.capTable = type._reader.capTable;
    local_110.pointer = type._reader.pointers;
    local_110.nestingLimit = type._reader.nestingLimit;
    _::PointerReader::getStruct(&local_f0,&local_110,(word *)0x0);
    local_170.ptr.isSet = (brandBindings->ptr).isSet;
    if (local_170.ptr.isSet == true) {
      local_170.ptr.field_1.value.ptr = (brandBindings->ptr).field_1.value.ptr;
      local_170.ptr.field_1.value.size_ = (brandBindings->ptr).field_1.value.size_;
    }
    type_00._reader.capTable = local_f0.capTable;
    type_00._reader.segment = local_f0.segment;
    type_00._reader.data = local_f0.data;
    type_00._reader.pointers = local_f0.pointers;
    type_00._reader.dataSize = local_f0.dataSize;
    type_00._reader.pointerCount = local_f0.pointerCount;
    type_00._reader._38_2_ = local_f0._38_2_;
    type_00._reader.nestingLimit = local_f0.nestingLimit;
    type_00._reader._44_4_ = local_f0._44_4_;
    makeDep(this,result,type_00,scopeName,&local_170);
    result->listDepth = result->listDepth + 1;
    return;
  case 0xf:
    if (type._reader.dataSize < 0x80) {
      typeId = 0;
    }
    else {
      typeId = *(uint64_t *)((long)type._reader.data + 8);
    }
    if (type._reader.pointerCount == 0) {
      type._reader.nestingLimit = 0x7fffffff;
      type._reader.capTable = (CapTableReader *)0x0;
      type._reader.pointers = (WirePointer *)0x0;
      type._reader.segment = (SegmentReader *)0x0;
    }
    local_110.segment = type._reader.segment;
    local_110.capTable = type._reader.capTable;
    local_110.pointer = type._reader.pointers;
    local_110.nestingLimit = type._reader.nestingLimit;
    _::PointerReader::getStruct(&local_90,&local_110,(word *)0x0);
    local_140.ptr.isSet = (brandBindings->ptr).isSet;
    if (local_140.ptr.isSet == true) {
      local_140.ptr.field_1.value.ptr = (brandBindings->ptr).field_1.value.ptr;
      local_140.ptr.field_1.value.size_ = (brandBindings->ptr).field_1.value.size_;
    }
    brandBindings_00 = &local_140;
    whichType = ENUM;
    expectedKind = ENUM;
    local_c0.segment = local_90.segment;
    local_c0.capTable = local_90.capTable;
    local_c0.data = local_90.data;
    local_c0.pointers = local_90.pointers;
    local_c0._32_8_ = local_90._32_8_;
    local_c0._40_8_ = local_90._40_8_;
    break;
  case 0x10:
    if (type._reader.dataSize < 0x80) {
      typeId = 0;
    }
    else {
      typeId = *(uint64_t *)((long)type._reader.data + 8);
    }
    if (type._reader.pointerCount == 0) {
      type._reader.nestingLimit = 0x7fffffff;
      type._reader.capTable = (CapTableReader *)0x0;
      type._reader.pointers = (WirePointer *)0x0;
      type._reader.segment = (SegmentReader *)0x0;
    }
    local_110.segment = type._reader.segment;
    local_110.capTable = type._reader.capTable;
    local_110.pointer = type._reader.pointers;
    local_110.nestingLimit = type._reader.nestingLimit;
    _::PointerReader::getStruct(&local_60,&local_110,(word *)0x0);
    local_128.ptr.isSet = (brandBindings->ptr).isSet;
    if (local_128.ptr.isSet == true) {
      local_128.ptr.field_1.value.ptr = (brandBindings->ptr).field_1.value.ptr;
      local_128.ptr.field_1.value.size_ = (brandBindings->ptr).field_1.value.size_;
    }
    brandBindings_00 = &local_128;
    whichType = STRUCT;
    expectedKind = STRUCT;
    local_c0.segment = local_60.segment;
    local_c0.capTable = local_60.capTable;
    local_c0.data = local_60.data;
    local_c0.pointers = local_60.pointers;
    local_c0._32_8_ = local_60._32_8_;
    local_c0._40_8_ = local_60._40_8_;
    break;
  case 0x11:
    if (type._reader.dataSize < 0x80) {
      typeId = 0;
    }
    else {
      typeId = *(uint64_t *)((long)type._reader.data + 8);
    }
    if (type._reader.pointerCount == 0) {
      type._reader.nestingLimit = 0x7fffffff;
      type._reader.capTable = (CapTableReader *)0x0;
      type._reader.pointers = (WirePointer *)0x0;
      type._reader.segment = (SegmentReader *)0x0;
    }
    local_110.segment = type._reader.segment;
    local_110.capTable = type._reader.capTable;
    local_110.pointer = type._reader.pointers;
    local_110.nestingLimit = type._reader.nestingLimit;
    _::PointerReader::getStruct(&local_c0,&local_110,(word *)0x0);
    local_158.ptr.isSet = (brandBindings->ptr).isSet;
    if (local_158.ptr.isSet == true) {
      local_158.ptr.field_1.value.ptr = (brandBindings->ptr).field_1.value.ptr;
      local_158.ptr.field_1.value.size_ = (brandBindings->ptr).field_1.value.size_;
    }
    brandBindings_00 = &local_158;
    whichType = INTERFACE;
    expectedKind = INTERFACE;
    break;
  case 0x12:
    result->which = '\x12';
    if (type._reader.dataSize < 0x50) {
      sVar7 = 0;
    }
    else {
      sVar7 = *(short *)((long)type._reader.data + 8);
    }
    if (sVar7 == 0) {
      return;
    }
    if (sVar7 == 2) {
      result->isImplicitParameter = true;
      if (type._reader.dataSize < 0x60) {
        uVar8 = 0;
      }
      else {
        uVar8 = *(uint16_t *)((long)type._reader.data + 10);
      }
      result->paramIndex = uVar8;
      return;
    }
    if (sVar7 == 1) {
      if (type._reader.dataSize < 0xc0) {
        pRVar9 = (RawBrandedSchema *)0x0;
      }
      else {
        pRVar9 = *(RawBrandedSchema **)((long)type._reader.data + 0x10);
      }
      if (type._reader.dataSize < 0x60) {
        uVar10 = 0;
      }
      else {
        uVar10 = *(ushort *)((long)type._reader.data + 10);
      }
      if ((brandBindings->ptr).isSet == true) {
        sVar2 = (brandBindings->ptr).field_1.value.size_;
        if (sVar2 == 0) {
          return;
        }
        pSVar3 = (brandBindings->ptr).field_1.value.ptr;
        lVar11 = 0;
        while (*(RawBrandedSchema **)((long)&pSVar3->typeId + lVar11) != pRVar9) {
          lVar11 = lVar11 + 0x18;
          if (sVar2 * 0x18 == lVar11) {
            return;
          }
        }
        if ((&pSVar3->isUnbound)[lVar11] != true) {
          if (*(uint *)((long)&pSVar3->bindingCount + lVar11) <= (uint)uVar10) {
            return;
          }
          puVar1 = (undefined8 *)
                   (*(long *)((long)&pSVar3->bindings + lVar11) + (ulong)uVar10 * 0x10);
          uVar4 = *puVar1;
          aVar5 = *(anon_union_8_2_eba6ea51_for_Binding_4 *)(puVar1 + 1);
          result->which = (char)uVar4;
          result->isImplicitParameter = (bool)(char)((ulong)uVar4 >> 8);
          result->listDepth = (short)((ulong)uVar4 >> 0x10);
          result->paramIndex = (short)((ulong)uVar4 >> 0x20);
          *(short *)&result->field_0x6 = (short)((ulong)uVar4 >> 0x30);
          result->field_4 = aVar5;
          return;
        }
      }
      (result->field_4).schema = pRVar9;
      result->paramIndex = uVar10;
      return;
    }
  default:
    kj::_::unreachable();
  }
  brand._reader.capTable = local_c0.capTable;
  brand._reader.segment = local_c0.segment;
  brand._reader.data = local_c0.data;
  brand._reader.pointers = local_c0.pointers;
  brand._reader.dataSize = local_c0.dataSize;
  brand._reader.pointerCount = local_c0.pointerCount;
  brand._reader._38_2_ = local_c0._38_2_;
  brand._reader.nestingLimit = local_c0.nestingLimit;
  brand._reader._44_4_ = local_c0._44_4_;
  makeDep(this,result,typeId,whichType,expectedKind,brand,scopeName,brandBindings_00);
  return;
}

Assistant:

void SchemaLoader::Impl::makeDep(_::RawBrandedSchema::Binding& result,
    schema::Type::Reader type, kj::StringPtr scopeName,
    kj::Maybe<kj::ArrayPtr<const _::RawBrandedSchema::Scope>> brandBindings) {
  switch (type.which()) {
    case schema::Type::VOID:
    case schema::Type::BOOL:
    case schema::Type::INT8:
    case schema::Type::INT16:
    case schema::Type::INT32:
    case schema::Type::INT64:
    case schema::Type::UINT8:
    case schema::Type::UINT16:
    case schema::Type::UINT32:
    case schema::Type::UINT64:
    case schema::Type::FLOAT32:
    case schema::Type::FLOAT64:
    case schema::Type::TEXT:
    case schema::Type::DATA:
      result.which = static_cast<uint8_t>(type.which());
      return;

    case schema::Type::STRUCT: {
      auto structType = type.getStruct();
      makeDep(result, structType.getTypeId(), schema::Type::STRUCT, schema::Node::STRUCT,
              structType.getBrand(), scopeName, brandBindings);
      return;
    }
    case schema::Type::ENUM: {
      auto enumType = type.getEnum();
      makeDep(result, enumType.getTypeId(), schema::Type::ENUM, schema::Node::ENUM,
              enumType.getBrand(), scopeName, brandBindings);
      return;
    }
    case schema::Type::INTERFACE: {
      auto interfaceType = type.getInterface();
      makeDep(result, interfaceType.getTypeId(), schema::Type::INTERFACE, schema::Node::INTERFACE,
              interfaceType.getBrand(), scopeName, brandBindings);
      return;
    }

    case schema::Type::LIST: {
      makeDep(result, type.getList().getElementType(), scopeName, brandBindings);
      ++result.listDepth;
      return;
    }

    case schema::Type::ANY_POINTER: {
      result.which = static_cast<uint8_t>(schema::Type::ANY_POINTER);
      auto anyPointer = type.getAnyPointer();
      switch (anyPointer.which()) {
        case schema::Type::AnyPointer::UNCONSTRAINED:
          return;
        case schema::Type::AnyPointer::PARAMETER: {
          auto param = anyPointer.getParameter();
          uint64_t id = param.getScopeId();
          uint16_t index = param.getParameterIndex();

          KJ_IF_SOME(b, brandBindings) {
            // TODO(perf): We could binary search here, but... bleh.
            for (auto& scope: b) {
              if (scope.typeId == id) {
                if (scope.isUnbound) {
                  // Unbound brand parameter.
                  result.scopeId = id;
                  result.paramIndex = index;
                  return;
                } else if (index >= scope.bindingCount) {
                  // Binding index out-of-range. Treat as AnyPointer. This is important to allow
                  // new type parameters to be added to existing types without breaking dependent
                  // schemas.
                  return;
                } else {
                  result = scope.bindings[index];
                  return;
                }
              }
            }
            return;
          } else {
            // Unbound brand parameter.
            result.scopeId = id;
            result.paramIndex = index;
            return;
          }
        }
        case schema::Type::AnyPointer::IMPLICIT_METHOD_PARAMETER:
          result.isImplicitParameter = true;
          result.paramIndex = anyPointer.getImplicitMethodParameter().getParameterIndex();
          return;
      }
      KJ_UNREACHABLE;
    }
  }